

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O1

SESSION_TYPE __thiscall
brynet::net::TcpService::MakeID
          (TcpService *this,size_t loopIndex,shared_ptr<brynet::net::IOLoopData> *loopData)

{
  int iVar1;
  element_type *peVar2;
  size_t sVar3;
  
  sVar3 = TypeIDS<brynet::net::DataSocket_*>::claimID
                    (&((loopData->
                       super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->mDataSockets);
  peVar2 = (loopData->super___shared_ptr<brynet::net::IOLoopData,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  iVar1 = peVar2->mNextId;
  peVar2->mNextId = iVar1 + 1;
  return CONCAT44(iVar1,(int)sVar3 << 0x10) | loopIndex & 0xffff;
}

Assistant:

TcpService::SESSION_TYPE TcpService::MakeID(size_t loopIndex, 
    const std::shared_ptr<IOLoopData>& loopData)
{
    union SessionId sid;
    sid.data.loopIndex = static_cast<uint16_t>(loopIndex);
    sid.data.index = static_cast<uint16_t>(loopData->getDataSockets().claimID());
    sid.data.iid = loopData->incID();

    return sid.id;
}